

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Matchers::Exception::ExceptionMessageMatcher::ExceptionMessageMatcher
          (ExceptionMessageMatcher *this,string *message)

{
  string *in_RSI;
  undefined8 *in_RDI;
  MatcherBase<std::exception> *in_stack_ffffffffffffffe0;
  
  Impl::MatcherBase<std::exception>::MatcherBase(in_stack_ffffffffffffffe0);
  *in_RDI = &PTR__ExceptionMessageMatcher_0048e8b0;
  in_RDI[5] = &DAT_0048e8e0;
  std::__cxx11::string::string((string *)(in_RDI + 6),in_RSI);
  return;
}

Assistant:

ExceptionMessageMatcher(std::string const& message):
        m_message(message)
    {}